

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

ItemType __thiscall jrtplib::RTCPSDESPacket::GetItemType(RTCPSDESPacket *this)

{
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local._4_4_ = None;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local._4_4_ = None;
  }
  else {
    switch(this->currentchunk[this->itemoffset]) {
    case '\0':
      this_local._4_4_ = None;
      break;
    case '\x01':
      this_local._4_4_ = CNAME;
      break;
    case '\x02':
      this_local._4_4_ = NAME;
      break;
    case '\x03':
      this_local._4_4_ = EMAIL;
      break;
    case '\x04':
      this_local._4_4_ = PHONE;
      break;
    case '\x05':
      this_local._4_4_ = LOC;
      break;
    case '\x06':
      this_local._4_4_ = TOOL;
      break;
    case '\a':
      this_local._4_4_ = NOTE;
      break;
    case '\b':
      this_local._4_4_ = PRIV;
      break;
    default:
      this_local._4_4_ = Unknown;
    }
  }
  return this_local._4_4_;
}

Assistant:

inline RTCPSDESPacket::ItemType RTCPSDESPacket::GetItemType() const
{
	if (!knownformat)
		return None;
	if (currentchunk == 0)
		return None;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	switch (sdeshdr->sdesid)
	{
	case 0:
		return None;
	case RTCP_SDES_ID_CNAME:
		return CNAME;
	case RTCP_SDES_ID_NAME:
		return NAME;
	case RTCP_SDES_ID_EMAIL:
		return EMAIL;
	case RTCP_SDES_ID_PHONE:
		return PHONE;
	case RTCP_SDES_ID_LOCATION:
		return LOC;
	case RTCP_SDES_ID_TOOL:
		return TOOL;
	case RTCP_SDES_ID_NOTE:
		return NOTE;
	case RTCP_SDES_ID_PRIVATE:
		return PRIV;
	default:
		return Unknown;
	}
	return Unknown;
}